

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O1

pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
* __thiscall
jessilib::
word_split_once<std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>,signed_char>
          (pair<std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
           *__return_storage_ptr__,jessilib *this,
          __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
          begin,__normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
                end,char in_whitespace)

{
  anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
  *paVar3;
  jessilib jVar4;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  _Var5;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> *this_00;
  __normal_iterator<const_signed_char_*,_std::__cxx11::basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_>
  _Var6;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_90;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_70;
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_> local_50;
  
  paVar2 = &local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  if (this < begin._M_current) {
    jVar4 = SUB81(end._M_current,0);
    do {
      _Var6._M_current = (char *)this;
      _Var5._M_current = (char *)this;
      if (*this != jVar4) break;
      this = this + 1;
      _Var6._M_current = begin._M_current;
      _Var5._M_current = begin._M_current;
    } while (this != (jessilib *)begin._M_current);
    do {
      local_90._M_dataplus._M_p = (pointer)paVar2;
      local_70._M_dataplus._M_p = (pointer)paVar3;
      if (_Var6._M_current == begin._M_current) goto LAB_003f98a7;
      if ((jessilib)*_Var6._M_current == jVar4) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::
        basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>::
        _M_construct<__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
                  ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
                    *)&local_50,_Var5._M_current,_Var6._M_current);
        std::__cxx11::
        basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::
        operator=(&local_90,&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        goto LAB_003f9914;
      }
      _Var6._M_current = (char *)((jessilib *)_Var6._M_current + 1);
    } while( true );
  }
  (__return_storage_ptr__->first)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first).field_2._M_local_buf[0] = '\0';
  *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 1) =
       CONCAT17(local_90.field_2._M_local_buf[8],local_90.field_2._M_allocated_capacity._1_7_);
  *(undefined4 *)((long)&(__return_storage_ptr__->first).field_2 + 9) = local_90.field_2._9_4_;
  *(undefined2 *)((long)&(__return_storage_ptr__->first).field_2 + 0xd) = local_90.field_2._13_2_;
  (__return_storage_ptr__->first).field_2._M_local_buf[0xf] = local_90.field_2._M_local_buf[0xf];
  local_70._M_string_length = 0;
  (__return_storage_ptr__->first)._M_string_length = 0;
  (__return_storage_ptr__->second)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second).field_2._M_allocated_capacity =
       (ulong)(uint7)local_70.field_2._M_allocated_capacity._1_7_ << 8;
  *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_70.field_2._8_8_;
  goto LAB_003f983c;
LAB_003f98a7:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
  ::
  _M_construct<__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
            ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>> *)
             &local_50,_Var5._M_current,begin._M_current);
  this_00 = &local_90;
  goto LAB_003f994e;
  while (_Var5._M_current = _Var6._M_current, (jessilib)*_Var6._M_current == jVar4) {
LAB_003f9914:
    _Var6._M_current = _Var6._M_current + 1;
    _Var5._M_current = begin._M_current;
    if (_Var6._M_current == begin._M_current) break;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>
  ::
  _M_construct<__gnu_cxx::__normal_iterator<signed_char_const*,std::__cxx11::basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>>>>
            ((basic_string<signed_char,std::char_traits<signed_char>,std::allocator<signed_char>> *)
             &local_50,_Var5._M_current,begin._M_current);
  this_00 = &local_70;
LAB_003f994e:
  std::__cxx11::
  basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>::operator=
            (this_00,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  paVar1 = &(__return_storage_ptr__->first).field_2;
  (__return_storage_ptr__->first)._M_dataplus._M_p = (pointer)paVar1;
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_90._M_dataplus._M_p == paVar2) {
    paVar1->_M_allocated_capacity =
         CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
    *(ulong *)((long)&(__return_storage_ptr__->first).field_2 + 8) =
         CONCAT17(local_90.field_2._M_local_buf[0xf],
                  CONCAT25(local_90.field_2._13_2_,
                           CONCAT41(local_90.field_2._9_4_,local_90.field_2._M_local_buf[8])));
  }
  else {
    (__return_storage_ptr__->first)._M_dataplus._M_p = local_90._M_dataplus._M_p;
    (__return_storage_ptr__->first).field_2._M_allocated_capacity =
         CONCAT71(local_90.field_2._M_allocated_capacity._1_7_,local_90.field_2._M_local_buf[0]);
  }
  (__return_storage_ptr__->first)._M_string_length = local_90._M_string_length;
  paVar2 = &(__return_storage_ptr__->second).field_2;
  (__return_storage_ptr__->second)._M_dataplus._M_p = (pointer)paVar2;
  if ((anon_union_16_2_edb7204a_for_basic_string<signed_char,_std::char_traits<signed_char>,_std::allocator<signed_char>_>_11
       *)local_70._M_dataplus._M_p == paVar3) {
    paVar2->_M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
    *(undefined8 *)((long)&(__return_storage_ptr__->second).field_2 + 8) = local_70.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->second)._M_dataplus._M_p = local_70._M_dataplus._M_p;
    (__return_storage_ptr__->second).field_2._M_allocated_capacity =
         CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,local_70.field_2._M_local_buf[0]);
  }
LAB_003f983c:
  (__return_storage_ptr__->second)._M_string_length = local_70._M_string_length;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}